

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall
Lowerer::GenerateFastPush
          (Lowerer *this,Opnd *baseOpndParam,Opnd *src,Instr *callInstr,Instr *insertInstr,
          LabelInstr *labelHelper,LabelInstr *doneLabel,LabelInstr *bailOutLabelHelper,
          bool returnLength)

{
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  ValueType VVar4;
  undefined4 *puVar5;
  StackSym *pSVar6;
  StackSym *pSVar7;
  RegOpnd *indexOpnd;
  IndirOpnd *pIVar8;
  undefined1 local_90 [8];
  AutoReuseOpnd autoReuseBaseOpnd;
  AutoReuseOpnd autoReuseArrayOpnd;
  AutoReuseOpnd autoReuseArrayLengthOpnd;
  bool local_35;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [2];
  bool isStringIndex;
  ValueType arrValueType;
  bool isTypedArrayElement;
  
  bVar2 = ShouldGenerateArrayFastPath(this,baseOpndParam,false,false,false);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x537a,"(ShouldGenerateArrayFastPath(baseOpndParam, false, false, false))",
                       "ShouldGenerateArrayFastPath(baseOpndParam, false, false, false)");
    if (!bVar2) goto LAB_005e18ab;
    *puVar5 = 0;
  }
  OVar3 = IR::Opnd::GetKind(baseOpndParam);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar2) goto LAB_005e18ab;
    *puVar5 = 0;
  }
  local_90 = (undefined1  [8])0x0;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_90,baseOpndParam,this->m_func,true);
  local_34 = (baseOpndParam->m_valueType).field_0;
  autoReuseArrayOpnd.autoDelete = false;
  autoReuseArrayOpnd.wasInUse = false;
  autoReuseArrayOpnd._18_6_ = 0;
  bVar2 = ValueType::IsAnyOptimizedArray((ValueType *)&local_34.field_0);
  if (bVar2) {
    bVar2 = IR::RegOpnd::IsArrayRegOpnd((RegOpnd *)baseOpndParam);
    if (!bVar2) goto LAB_005e166c;
    bVar2 = IR::RegOpnd::IsArrayRegOpnd((RegOpnd *)baseOpndParam);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x24d,"(IsArrayRegOpnd())","IsArrayRegOpnd()");
      if (!bVar2) goto LAB_005e18ab;
      *puVar5 = 0;
    }
    pSVar6 = IR::ArrayRegOpnd::LengthSym((ArrayRegOpnd *)baseOpndParam);
    if (pSVar6 == (StackSym *)0x0) goto LAB_005e166c;
    pSVar6 = IR::ArrayRegOpnd::LengthSym((ArrayRegOpnd *)baseOpndParam);
    pSVar7 = IR::ArrayRegOpnd::LengthSym((ArrayRegOpnd *)baseOpndParam);
    indexOpnd = IR::RegOpnd::New(pSVar6,pSVar7->m_type,this->m_func);
    indexOpnd->field_0x18 = indexOpnd->field_0x18 | 0x40;
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)&autoReuseArrayOpnd.autoDelete,&indexOpnd->super_Opnd,this->m_func,
               true);
  }
  else {
    baseOpndParam =
         &GenerateArrayTest(this,(RegOpnd *)baseOpndParam,labelHelper,labelHelper,insertInstr,false,
                            true,false)->super_Opnd;
    local_32[0] = (((RegOpnd *)baseOpndParam)->super_Opnd).m_valueType.field_0;
    VVar4 = ValueType::ToDefiniteObject((ValueType *)&local_32[0].field_0);
    autoReuseBaseOpnd._16_2_ = VVar4.field_0;
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetHasNoMissingValues((ValueType *)&autoReuseBaseOpnd.autoDelete,false);
LAB_005e166c:
    indexOpnd = (RegOpnd *)0x0;
  }
  autoReuseBaseOpnd.autoDelete = false;
  autoReuseBaseOpnd.wasInUse = false;
  autoReuseBaseOpnd._18_6_ = 0;
  IR::AutoReuseOpnd::Initialize
            ((AutoReuseOpnd *)&autoReuseBaseOpnd.autoDelete,baseOpndParam,this->m_func,true);
  if (indexOpnd == (RegOpnd *)0x0) {
    indexOpnd = IR::RegOpnd::New(TyUint32,this->m_func);
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)&autoReuseArrayOpnd.autoDelete,&indexOpnd->super_Opnd,this->m_func,
               true);
    pIVar8 = IR::IndirOpnd::New((RegOpnd *)baseOpndParam,0x20,(indexOpnd->super_Opnd).m_type,
                                this->m_func,false);
    InsertMove(&indexOpnd->super_Opnd,&pIVar8->super_Opnd,insertInstr,true);
  }
  pIVar8 = IR::IndirOpnd::New((RegOpnd *)baseOpndParam,indexOpnd,TyVar,this->m_func);
  IR::Opnd::SetValueType(&pIVar8->m_baseOpnd->super_Opnd,(ValueType)local_34.field_0);
  autoReuseArrayLengthOpnd._16_8_ = src;
  if (returnLength) {
    bVar2 = IR::Opnd::IsEqual(src,insertInstr->m_dst);
    if (bVar2) {
      autoReuseArrayLengthOpnd._16_8_ = IR::RegOpnd::New(src->m_type,this->m_func);
      InsertMove((Opnd *)autoReuseArrayLengthOpnd._16_8_,src,insertInstr,true);
    }
  }
  pIVar8 = GenerateFastElemICommon
                     (this,insertInstr,true,pIVar8,labelHelper,labelHelper,(LabelInstr *)0x0,
                      (bool *)local_32,&local_35,(bool *)0x0,(Opnd **)0x0,(LabelInstr **)0x0,false,
                      false,returnLength,bailOutLabelHelper,(bool *)0x0,FldInfo_NoInfo);
  if ((undefined1)local_32[0].bits == '\x01') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x53c6,"(!isTypedArrayElement)","!isTypedArrayElement");
    if (!bVar2) goto LAB_005e18ab;
    *puVar5 = 0;
  }
  if (pIVar8 == (IndirOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x53c7,"(indirOpnd)","indirOpnd");
    if (!bVar2) {
LAB_005e18ab:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  InsertMove(&pIVar8->super_Opnd,(Opnd *)autoReuseArrayLengthOpnd._16_8_,insertInstr,true);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseBaseOpnd.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseArrayOpnd.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_90);
  return true;
}

Assistant:

bool Lowerer::GenerateFastPush(IR::Opnd *baseOpndParam, IR::Opnd *src, IR::Instr *callInstr,
    IR::Instr *insertInstr, IR::LabelInstr *labelHelper, IR::LabelInstr *doneLabel, IR::LabelInstr * bailOutLabelHelper, bool returnLength)
{
    Assert(ShouldGenerateArrayFastPath(baseOpndParam, false, false, false));

    //     TEST baseOpnd, AtomTag                  -- check baseOpnd not tagged int
    //     JNE $helper
    //     CMP [baseOpnd], JavascriptArray::`vtable' -- check baseOpnd isArray
    //     JNE $helper
    //     MOV r2, [baseOpnd + offset(length)]     -- Load array length

    IR::RegOpnd *       baseOpnd = baseOpndParam->AsRegOpnd();
    const IR::AutoReuseOpnd autoReuseBaseOpnd(baseOpnd, m_func);

    ValueType arrValueType(baseOpndParam->GetValueType());
    IR::RegOpnd *arrayOpnd = baseOpnd;
    IR::RegOpnd *arrayLengthOpnd = nullptr;
    IR::AutoReuseOpnd autoReuseArrayLengthOpnd;
    if(!arrValueType.IsAnyOptimizedArray())
    {
        arrayOpnd = GenerateArrayTest(baseOpnd, labelHelper, labelHelper, insertInstr, false, true);
        arrValueType = arrayOpnd->GetValueType().ToDefiniteObject().SetHasNoMissingValues(false);
    }
    else if(arrayOpnd->IsArrayRegOpnd())
    {
        IR::ArrayRegOpnd *const arrayRegOpnd = arrayOpnd->AsArrayRegOpnd();
        if(arrayRegOpnd->LengthSym())
        {
            arrayLengthOpnd = IR::RegOpnd::New(arrayRegOpnd->LengthSym(), arrayRegOpnd->LengthSym()->GetType(), m_func);
            DebugOnly(arrayLengthOpnd->FreezeSymValue());
            autoReuseArrayLengthOpnd.Initialize(arrayLengthOpnd, m_func);
        }
    }
    const IR::AutoReuseOpnd autoReuseArrayOpnd(arrayOpnd, m_func);

    if(!arrayLengthOpnd)
    {
        //     MOV arrayLength, [array + offset(length)]     -- Load array length
        // We know this index is safe since, so mark it as UInt32 to avoid unnecessary conversion/checks
        arrayLengthOpnd = IR::RegOpnd::New(TyUint32, m_func);
        autoReuseArrayLengthOpnd.Initialize(arrayLengthOpnd, m_func);
        InsertMove(
            arrayLengthOpnd,
            IR::IndirOpnd::New(arrayOpnd, Js::JavascriptArray::GetOffsetOfLength(), arrayLengthOpnd->GetType(), this->m_func),
            insertInstr);
    }

    IR::IndirOpnd *arrayRef = IR::IndirOpnd::New(arrayOpnd, arrayLengthOpnd, TyVar, this->m_func);
    arrayRef->GetBaseOpnd()->SetValueType(arrValueType);

    if (returnLength && src->IsEqual(insertInstr->GetDst()))
    {
        //If the dst is same as the src, then dst is going to be overridden by GenerateFastElemICommon in process of updating the length.
        //Save it in a temp register.
        IR::RegOpnd *opnd = IR::RegOpnd::New(src->GetType(), this->m_func);
        InsertMove(opnd, src, insertInstr);
        src = opnd;
    }

    //Array length is going to overflow, hence don't check for Array.length and Segment.length overflow.
    bool isTypedArrayElement, isStringIndex;
    IR::IndirOpnd *const indirOpnd =
        GenerateFastElemICommon(
            insertInstr,
            true,
            arrayRef,
            labelHelper,
            labelHelper,
            nullptr,
            &isTypedArrayElement,
            &isStringIndex,
            nullptr,
            nullptr,
            nullptr /*pLabelSegmentLengthIncreased*/,
            false /*checkArrayLengthOverflow*/,
            true /* forceGenerateFastPath */,
            returnLength,
            bailOutLabelHelper);

    Assert(!isTypedArrayElement);
    Assert(indirOpnd);

    //  MOV [r3 + r2], src
    InsertMoveWithBarrier(indirOpnd, src, insertInstr);

    return true;
}